

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_constant.hpp
# Opt level: O3

ostream * viennamath::operator<<(ostream *stream,ct_constant<35L> *c)

{
  string local_30;
  
  ct_constant<35l>::str_abi_cxx11_(&local_30,c);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream,
                           ct_constant<value_> const & c)
  {
    stream << c.str();
    return stream;
  }